

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONScanner.cpp
# Opt level: O2

tokens __thiscall JSON::JSONScanner::Scan(JSONScanner *this)

{
  char16_t *psz;
  char16_t cVar1;
  Token *pTVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  char16_t *pcVar6;
  undefined4 *puVar7;
  char16_t *pcVar8;
  char16_t *local_30;
  char16 *end;
  
  this->pTokenString = this->currentChar;
  pcVar8 = this->inputText + this->inputLen;
  pcVar6 = this->currentChar + 3;
  do {
    psz = pcVar6 + -3;
    if (pcVar8 <= psz) {
LAB_00a39949:
      this->pToken->tk = tkEOF;
      return tkEOF;
    }
    this->currentChar = pcVar6 + -2;
    cVar1 = pcVar6[-3];
    if (1 < (ushort)cVar1 - 9) {
      switch(cVar1) {
      case L' ':
        break;
      case L'!':
      case L'#':
      case L'$':
      case L'%':
      case L'&':
      case L'\'':
      case L'(':
      case L')':
      case L'*':
      case L'+':
      case L'.':
      case L'/':
switchD_00a397cf_caseD_21:
        ThrowSyntaxError(this,-0x7ff5e9e9);
      case L'\"':
        ScanString(this);
        return tkStrCon;
      case L',':
        this->pToken->tk = tkComma;
        return tkComma;
      case L'-':
        this->pToken->tk = tkSub;
        return tkSub;
      case L'0':
      case L'1':
      case L'2':
      case L'3':
      case L'4':
      case L'5':
      case L'6':
      case L'7':
      case L'8':
      case L'9':
        this->currentChar = psz;
        bVar4 = IsJSONNumber(this);
        if (bVar4) {
          this->currentChar = psz;
          local_30 = (char16 *)0x0;
          end = (char16 *)Js::NumberUtilities::StrToDbl<char16_t>(psz,&local_30,this->scriptContext)
          ;
          if (this->currentChar != local_30) {
            BVar5 = Js::JavascriptNumber::IsNan((double)end);
            if (BVar5 != 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar7 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONScanner.cpp"
                                 ,0x5f,"(!Js::JavascriptNumber::IsNan(val))",
                                 "Bad result from string to double conversion");
              if (!bVar4) {
                pcVar3 = (code *)invalidInstructionException();
                (*pcVar3)();
              }
              *puVar7 = 0;
            }
            pTVar2 = this->pToken;
            pTVar2->tk = tkFltCon;
            (pTVar2->u).field_0.pid = (IdentPtr)end;
            (pTVar2->u).field_2.maybeInt = false;
            this->currentChar = local_30;
            return tkFltCon;
          }
        }
        ThrowSyntaxError(this,-0x7ff5e9ea);
      case L':':
        this->pToken->tk = tkColon;
        return tkColon;
      default:
        if (cVar1 != L'\r') {
          if (cVar1 != L'\0') {
            if (cVar1 == L'[') {
              this->pToken->tk = tkLBrack;
              return tkLBrack;
            }
            if (cVar1 == L']') {
              this->pToken->tk = tkRBrack;
              return tkRBrack;
            }
            if (cVar1 == L'f') {
              if ((((pcVar6 + 1 < pcVar8) && (pcVar6[-2] == L'a')) && (pcVar6[-1] == L'l')) &&
                 ((*pcVar6 == L's' && (pcVar6[1] == L'e')))) {
                this->currentChar = pcVar6 + 2;
                this->pToken->tk = tkFALSE;
                return tkFALSE;
              }
            }
            else if (cVar1 == L'n') {
              if (((pcVar6 < pcVar8) && (pcVar6[-2] == L'u')) &&
                 ((pcVar6[-1] == L'l' && (*pcVar6 == L'l')))) {
                this->currentChar = pcVar6 + 1;
                this->pToken->tk = tkNULL;
                return tkNULL;
              }
            }
            else if (cVar1 == L't') {
              if ((((pcVar6 < pcVar8) && (pcVar6[-2] == L'r')) && (pcVar6[-1] == L'u')) &&
                 (*pcVar6 == L'e')) {
                this->currentChar = pcVar6 + 1;
                this->pToken->tk = tkTRUE;
                return tkTRUE;
              }
            }
            else {
              if (cVar1 == L'{') {
                this->pToken->tk = tkLCurly;
                return tkLCurly;
              }
              if (cVar1 == L'}') {
                this->pToken->tk = tkRCurly;
                return tkRCurly;
              }
            }
            goto switchD_00a397cf_caseD_21;
          }
          this->currentChar = psz;
          goto LAB_00a39949;
        }
      }
    }
    pcVar6 = pcVar6 + 1;
  } while( true );
}

Assistant:

tokens JSONScanner::Scan()
    {
        pTokenString = currentChar;

        while (currentChar < inputText + inputLen)
        {
            switch(ReadNextChar())
            {
            case 0:
                //EOF
                currentChar--;
                return (pToken->tk = tkEOF);

            case '\t':
            case '\r':
            case '\n':
            case ' ':
                //WS - keep looping
                break;

            case '"':
                //check for string
                return ScanString();

            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
                //decimal digit starts a number
                {
                    currentChar--;

                    // we use StrToDbl() here for compat with the rest of the engine. StrToDbl() accept a larger syntax.
                    // Verify first the JSON grammar.
                    const char16* saveCurrentChar = currentChar;
                    if(!IsJSONNumber())
                    {
                       ThrowSyntaxError(JSERR_JsonBadNumber);
                    }
                    currentChar = saveCurrentChar;
                    double val;
                    const char16* end = nullptr;
                    val = Js::NumberUtilities::StrToDbl(currentChar, &end, scriptContext);
                    if(currentChar == end)
                    {
                       ThrowSyntaxError(JSERR_JsonBadNumber);
                    }
                    AssertMsg(!Js::JavascriptNumber::IsNan(val), "Bad result from string to double conversion");
                    pToken->tk = tkFltCon;
                    pToken->SetDouble(val, false);
                    currentChar = end;
                    return tkFltCon;
                }

            case ',':
                return (pToken->tk = tkComma);

            case ':':
                return (pToken->tk = tkColon);

            case '[':
                return (pToken->tk = tkLBrack);

            case ']':
                return (pToken->tk = tkRBrack);

            case '-':
                return (pToken->tk = tkSub);

            case 'n':
                //check for 'null'
                if (currentChar + 2 < inputText + inputLen  && currentChar[0] == 'u' && currentChar[1] == 'l' && currentChar[2] == 'l')
                {
                    currentChar += 3;
                    return (pToken->tk = tkNULL);
                }
               ThrowSyntaxError(JSERR_JsonIllegalChar);

            case 't':
                //check for 'true'
                if (currentChar + 2 < inputText + inputLen  && currentChar[0] == 'r' && currentChar[1] == 'u' && currentChar[2] == 'e')
                {
                    currentChar += 3;
                    return (pToken->tk = tkTRUE);
                }
               ThrowSyntaxError(JSERR_JsonIllegalChar);

            case 'f':
                //check for 'false'
                if (currentChar + 3 < inputText + inputLen  && currentChar[0] == 'a' && currentChar[1] == 'l' && currentChar[2] == 's' && currentChar[3] == 'e')
                {
                    currentChar += 4;
                    return (pToken->tk = tkFALSE);
                }
               ThrowSyntaxError(JSERR_JsonIllegalChar);

            case '{':
                return (pToken->tk = tkLCurly);

            case '}':
                return (pToken->tk = tkRCurly);

            default:
               ThrowSyntaxError(JSERR_JsonIllegalChar);
            }

        }

        return (pToken->tk = tkEOF);
    }